

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O1

void level_tele_trap(trap *trap)

{
  boolean bVar1;
  char *pcVar2;
  
  pcVar2 = "float";
  if ((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
     ((youmonst.data)->mlet != '\x05')) {
    pcVar2 = locomotion(youmonst.data,"step");
  }
  pline("You %s onto a level teleport trap!",pcVar2);
  if (u.uprops[0x2c].extrinsic == 0) {
    if (u.umonnum != u.umonster) {
      bVar1 = resists_magm(&youmonst);
      if (bVar1 != '\0') goto LAB_0025a228;
    }
  }
  else {
LAB_0025a228:
    shieldeff(u.ux,u.uy);
  }
  if (u.uprops[0x2c].extrinsic == 0) {
    if (u.umonnum != u.umonster) {
      bVar1 = resists_magm(&youmonst);
      if (bVar1 != '\0') goto LAB_0025a262;
    }
    if (u.uz.dnum != dungeon_topology.d_astral_level.dnum) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pcVar2 = "You are momentarily blinded by a flash of light.";
      }
      else {
        pcVar2 = "You are momentarily disoriented.";
      }
      pline(pcVar2);
      deltrap(level,trap);
      newsym((int)u.ux,(int)u.uy);
      level_tele();
      return;
    }
  }
LAB_0025a262:
  pline("You feel a wrenching sensation.");
  return;
}

Assistant:

void level_tele_trap(struct trap *trap)
{
	pline("You %s onto a level teleport trap!",
		      Levitation ? (const char *)"float" :
				  locomotion(youmonst.data, "step"));
	if (Antimagic) {
	    shieldeff(u.ux, u.uy);
	}
	if (Antimagic || In_endgame(&u.uz)) {
	    pline("You feel a wrenching sensation.");
	    return;
	}
	if (!Blind)
	    pline("You are momentarily blinded by a flash of light.");
	else
	    pline("You are momentarily disoriented.");
	deltrap(level, trap);
	newsym(u.ux,u.uy);	/* get rid of trap symbol */
	level_tele();
}